

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createRealloc
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,CallInst *CInst)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  PSNodeAlloc *pPVar4;
  PSNode *n;
  PSNode *n_00;
  size_t sVar5;
  size_t *psVar6;
  PSNodeAlloc *reall;
  PSNode *orig_mem;
  int local_44;
  PSNodeAlloc *local_40;
  PSNode *local_38;
  
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_repr = (PSNode *)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = getOperand(this,*(Value **)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5)));
  pPVar4 = (PSNodeAlloc *)PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
  local_40 = (PSNodeAlloc *)0x0;
  if ((pPVar4->super_PSNode).type == ALLOC) {
    local_40 = pPVar4;
  }
  local_40->is_heap = true;
  (local_40->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.user_data = CInst;
  psVar6 = &Offset::UNKNOWN;
  n = PointerGraph::
      create<(dg::pta::PSNodeType)20,dg::pta::PSNode*&,dg::pta::PSNodeAlloc*&,unsigned_long_const&>
                ((PointerGraph *)this,&local_38,&local_40,&Offset::UNKNOWN);
  local_44 = 0;
  n_00 = PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNodeAlloc*&,int>
                   ((PointerGraph *)this,&local_40,&local_44);
  pPVar4 = local_40;
  local_40->is_heap = true;
  lVar2 = *(long *)(CInst + (0x20 - (ulong)(uint)(*(int *)(CInst + 0x14) << 5)));
  if ((lVar2 == 0) || (*(char *)(lVar2 + 0x10) != '\x10')) {
LAB_00121b94:
    sVar5 = *psVar6;
    if (sVar5 != 0xffffffffffffffff) goto LAB_00121ba0;
  }
  else {
    uVar1 = *(uint *)(lVar2 + 0x20);
    psVar6 = (size_t *)(lVar2 + 0x18);
    if ((uVar1 < 0x41) || (iVar3 = llvm::APInt::countLeadingZerosSlowCase(), uVar1 - iVar3 < 0x41))
    {
      if (0x40 < uVar1) {
        psVar6 = (size_t *)*psVar6;
      }
      goto LAB_00121b94;
    }
  }
  sVar5 = 0;
LAB_00121ba0:
  (pPVar4->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.size = sVar5;
  PSNodesSeq::append(__return_storage_ptr__,&pPVar4->super_PSNode);
  PSNodesSeq::append(__return_storage_ptr__,n);
  PSNodesSeq::append(__return_storage_ptr__,n_00);
  __return_storage_ptr__->_repr = n_00;
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createRealloc(const llvm::CallInst *CInst) {
    using namespace llvm;

    PSNodesSeq ret;

    // we create new allocation node and memcpy old pointers there
    PSNode *orig_mem = getOperand(CInst->getOperand(0));
    PSNodeAlloc *reall = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());
    reall->setIsHeap();
    reall->setUserData(const_cast<llvm::CallInst *>(CInst));

    // copy everything that is in orig_mem to reall
    PSNode *mcp =
            PS.create<PSNodeType::MEMCPY>(orig_mem, reall, Offset::UNKNOWN);
    // we need the pointer in the last node that we return
    PSNode *ptr = PS.create<PSNodeType::CONSTANT>(reall, 0);

    reall->setIsHeap();
    reall->setSize(llvmutils::getConstantSizeValue(CInst->getOperand(1)));

    ret.append(reall);
    ret.append(mcp);
    ret.append(ptr);
    ret.setRepresentant(ptr);

    return ret;
}